

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::cmComputeLinkInformation
          (cmComputeLinkInformation *this,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  cmGlobalGenerator *pcVar3;
  cmMakefile *pcVar4;
  cmGeneratorTarget *this_00;
  pointer pbVar5;
  bool bVar6;
  TargetType TVar7;
  PolicyStatus PVar8;
  cmLocalGenerator *pcVar9;
  cmState *this_01;
  cmOrderDirectories *pcVar10;
  char *pcVar11;
  char *pcVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  pointer __v;
  string loader_flag_var;
  string rlVar;
  string rtSepVar;
  string local_150;
  string local_130;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  string *local_108;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_100;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  p_Var1 = &(this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Config)._M_dataplus._M_p = (pointer)&(this->Config).field_2;
  (this->Config)._M_string_length = 0;
  (this->Config).field_2._M_local_buf[0] = '\0';
  local_88 = &(this->LinkLanguage).field_2;
  (this->LinkLanguage)._M_dataplus._M_p = (pointer)local_88;
  (this->LinkLanguage)._M_string_length = 0;
  (this->LinkLanguage).field_2._M_local_buf[0] = '\0';
  local_90 = &(this->LibLinkFlag).field_2;
  (this->LibLinkFlag)._M_dataplus._M_p = (pointer)local_90;
  (this->LibLinkFlag)._M_string_length = 0;
  (this->LibLinkFlag).field_2._M_local_buf[0] = '\0';
  local_98 = &(this->LibLinkFileFlag).field_2;
  (this->LibLinkFileFlag)._M_dataplus._M_p = (pointer)local_98;
  (this->LibLinkFileFlag)._M_string_length = 0;
  (this->LibLinkFileFlag).field_2._M_local_buf[0] = '\0';
  local_a0 = &(this->LibLinkSuffix).field_2;
  (this->LibLinkSuffix)._M_dataplus._M_p = (pointer)local_a0;
  (this->LibLinkSuffix)._M_string_length = 0;
  (this->LibLinkSuffix).field_2._M_local_buf[0] = '\0';
  local_a8 = &(this->RuntimeFlag).field_2;
  (this->RuntimeFlag)._M_dataplus._M_p = (pointer)local_a8;
  (this->RuntimeFlag)._M_string_length = 0;
  (this->RuntimeFlag).field_2._M_local_buf[0] = '\0';
  local_b0 = &(this->RuntimeSep).field_2;
  (this->RuntimeSep)._M_dataplus._M_p = (pointer)local_b0;
  (this->RuntimeSep)._M_string_length = 0;
  (this->RuntimeSep).field_2._M_local_buf[0] = '\0';
  local_b8 = &(this->RuntimeAlways).field_2;
  (this->RuntimeAlways)._M_dataplus._M_p = (pointer)local_b8;
  (this->RuntimeAlways)._M_string_length = 0;
  (this->RuntimeAlways).field_2._M_local_buf[0] = '\0';
  local_c0 = &(this->RPathLinkFlag).field_2;
  (this->RPathLinkFlag)._M_dataplus._M_p = (pointer)local_c0;
  (this->RPathLinkFlag)._M_string_length = 0;
  (this->RPathLinkFlag).field_2._M_local_buf[0] = '\0';
  local_c8 = &(this->StaticLinkTypeFlag).field_2;
  (this->StaticLinkTypeFlag)._M_dataplus._M_p = (pointer)local_c8;
  (this->StaticLinkTypeFlag)._M_string_length = 0;
  (this->StaticLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  local_d0 = &(this->SharedLinkTypeFlag).field_2;
  (this->SharedLinkTypeFlag)._M_dataplus._M_p = (pointer)local_d0;
  (this->SharedLinkTypeFlag)._M_string_length = 0;
  (this->SharedLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ExtractStaticLibraryName).program = (char *)0x0;
  (this->ExtractSharedLibraryName).program = (char *)0x0;
  (this->ExtractAnyLibraryName).program = (char *)0x0;
  local_d8 = &(this->SharedRegexString).field_2;
  (this->SharedRegexString)._M_dataplus._M_p = (pointer)local_d8;
  (this->SharedRegexString)._M_string_length = 0;
  (this->SharedRegexString).field_2._M_local_buf[0] = '\0';
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->FrameworkPathsEmmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SplitFramework).program = (char *)0x0;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p_Var1 = &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &(this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Target = target;
  this->Makefile = target->Target->Makefile;
  local_38 = (string *)&this->Config;
  local_40 = (string *)&this->LinkLanguage;
  local_48 = &this->LibLinkFlag;
  local_50 = &this->LibLinkFileFlag;
  local_58 = &this->LibLinkSuffix;
  local_68 = &this->RuntimeFlag;
  local_70 = &this->RuntimeSep;
  local_78 = &this->RuntimeAlways;
  local_80 = &this->RPathLinkFlag;
  local_110 = &this->ImplicitLinkDirs;
  local_60 = &this->RuntimeLinkDirs;
  local_100 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->OldLinkDirMask;
  local_108 = config;
  pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
  pcVar3 = pcVar9->GlobalGenerator;
  this->GlobalGenerator = pcVar3;
  this->CMakeInstance = pcVar3->CMakeInstance;
  this_01 = cmMakefile::GetState(this->Makefile);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"FIND_LIBRARY_USE_OPENBSD_VERSIONING","");
  bVar6 = cmState::GetGlobalPropertyAsBool(this_01,&local_150);
  this->OpenBSD = bVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign(local_38);
  pcVar10 = (cmOrderDirectories *)operator_new(0x2d0);
  cmOrderDirectories::cmOrderDirectories(pcVar10,this->GlobalGenerator,target,"linker search path");
  this->OrderLinkerSearchPath = pcVar10;
  pcVar10 = (cmOrderDirectories *)operator_new(0x2d0);
  cmOrderDirectories::cmOrderDirectories(pcVar10,this->GlobalGenerator,target,"runtime search path")
  ;
  this->OrderRuntimeSearchPath = pcVar10;
  this->OrderDependentRPath = (cmOrderDirectories *)0x0;
  cmGeneratorTarget::GetLinkerLanguage(&local_150,this->Target,local_108);
  std::__cxx11::string::operator=(local_40,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((this->LinkLanguage)._M_string_length != 0) {
    pcVar4 = this->Makefile;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
    bVar6 = cmMakefile::IsDefinitionSet(pcVar4,&local_150);
    this->UseImportLibrary = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    this_00 = this->Target;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"LINK_DEPENDS_NO_SHARED","");
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_150);
    this->LinkDependsNoShared = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    this->LoaderFlag = (char *)0x0;
    if ((this->UseImportLibrary == false) &&
       (TVar7 = cmGeneratorTarget::GetType(this->Target), TVar7 == MODULE_LIBRARY)) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"CMAKE_SHARED_MODULE_LOADER_","");
      std::__cxx11::string::_M_append
                ((char *)&local_150,(ulong)(this->LinkLanguage)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_150);
      pcVar11 = cmMakefile::GetDefinition(this->Makefile,&local_150);
      this->LoaderFlag = pcVar11;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar4 = this->Makefile;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CMAKE_LINK_LIBRARY_FLAG","");
    pcVar12 = cmMakefile::GetSafeDefinition(pcVar4,&local_150);
    pcVar11 = (char *)(this->LibLinkFlag)._M_string_length;
    strlen(pcVar12);
    std::__cxx11::string::_M_replace((ulong)local_48,0,pcVar11,(ulong)pcVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = this->Makefile;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CMAKE_LINK_LIBRARY_FILE_FLAG","");
    pcVar12 = cmMakefile::GetSafeDefinition(pcVar4,&local_150);
    pcVar11 = (char *)(this->LibLinkFileFlag)._M_string_length;
    strlen(pcVar12);
    std::__cxx11::string::_M_replace((ulong)local_50,0,pcVar11,(ulong)pcVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = this->Makefile;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CMAKE_LINK_LIBRARY_SUFFIX","");
    pcVar12 = cmMakefile::GetSafeDefinition(pcVar4,&local_150);
    pcVar11 = (char *)(this->LibLinkSuffix)._M_string_length;
    strlen(pcVar12);
    std::__cxx11::string::_M_replace((ulong)local_58,0,pcVar11,(ulong)pcVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    this->RuntimeUseChrpath = false;
    TVar7 = cmGeneratorTarget::GetType(this->Target);
    if (TVar7 != STATIC_LIBRARY) {
      cmGeneratorTarget::GetType(this->Target);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"CMAKE_","");
      std::__cxx11::string::append((char *)&local_150);
      std::__cxx11::string::append((char *)&local_150);
      std::__cxx11::string::_M_append
                ((char *)&local_150,(ulong)(this->LinkLanguage)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_150);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_150._M_dataplus._M_p,
                 local_150._M_dataplus._M_p + local_150._M_string_length);
      std::__cxx11::string::append((char *)&local_f8);
      pcVar12 = cmMakefile::GetSafeDefinition(this->Makefile,&local_150);
      pcVar11 = (char *)(this->RuntimeFlag)._M_string_length;
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)local_68,0,pcVar11,(ulong)pcVar12);
      pcVar12 = cmMakefile::GetSafeDefinition(this->Makefile,&local_f8);
      pcVar11 = (char *)(this->RuntimeSep)._M_string_length;
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)local_70,0,pcVar11,(ulong)pcVar12);
      pcVar4 = this->Makefile;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH","");
      pcVar12 = cmMakefile::GetSafeDefinition(pcVar4,&local_130);
      pcVar11 = (char *)(this->RuntimeAlways)._M_string_length;
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)local_78,0,pcVar11,(ulong)pcVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      bVar6 = cmGeneratorTarget::IsChrpathUsed(this->Target,local_108);
      this->RuntimeUseChrpath = bVar6;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"CMAKE_","");
      std::__cxx11::string::append((char *)&local_130);
      std::__cxx11::string::append((char *)&local_130);
      std::__cxx11::string::_M_append
                ((char *)&local_130,(ulong)(this->LinkLanguage)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_130);
      pcVar12 = cmMakefile::GetSafeDefinition(this->Makefile,&local_130);
      pcVar11 = (char *)(this->RPathLinkFlag)._M_string_length;
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)local_80,0,pcVar11,(ulong)pcVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CMAKE_SHARED_LIBRARY_LINK_","");
    std::__cxx11::string::_M_append((char *)&local_150,(ulong)(this->LinkLanguage)._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)&local_150);
    bVar6 = cmMakefile::IsOn(this->Makefile,&local_150);
    this->LinkWithRuntimePath = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = this->Makefile;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME","");
    bVar6 = cmMakefile::IsOn(pcVar4,&local_150);
    this->NoSONameUsesPath = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    ComputeLinkTypeInfo(this);
    ComputeItemParserInfo(this);
    ComputeFrameworkInfo(this);
    this->SharedDependencyMode = SharedDepModeNone;
    pcVar4 = this->Makefile;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CMAKE_LINK_DEPENDENT_LIBRARY_FILES","");
    bVar6 = cmMakefile::IsOn(pcVar4,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      this->SharedDependencyMode = SharedDepModeLink;
    }
    else {
      pcVar4 = this->Makefile;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"CMAKE_LINK_DEPENDENT_LIBRARY_DIRS","");
      bVar6 = cmMakefile::IsOn(pcVar4,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        this->SharedDependencyMode = SharedDepModeLibDir;
      }
      else if ((this->RPathLinkFlag)._M_string_length != 0) {
        this->SharedDependencyMode = SharedDepModeDir;
        pcVar10 = (cmOrderDirectories *)operator_new(0x2d0);
        cmOrderDirectories::cmOrderDirectories
                  (pcVar10,this->GlobalGenerator,target,"dependent library path");
        this->OrderDependentRPath = pcVar10;
      }
    }
    pcVar10 = this->OrderLinkerSearchPath;
    pvVar13 = cmGeneratorTarget::GetLinkDirectories_abi_cxx11_(this->Target);
    cmOrderDirectories::AddUserDirectories(pcVar10,pvVar13);
    pcVar10 = this->OrderRuntimeSearchPath;
    pvVar13 = cmGeneratorTarget::GetLinkDirectories_abi_cxx11_(this->Target);
    cmOrderDirectories::AddUserDirectories(pcVar10,pvVar13);
    LoadImplicitLinkInfo(this);
    cmOrderDirectories::SetImplicitDirectories(this->OrderLinkerSearchPath,local_110);
    cmOrderDirectories::SetImplicitDirectories(this->OrderRuntimeSearchPath,local_110);
    if (this->OrderDependentRPath != (cmOrderDirectories *)0x0) {
      cmOrderDirectories::SetImplicitDirectories(this->OrderDependentRPath,local_110);
      cmOrderDirectories::AddLanguageDirectories(this->OrderDependentRPath,local_60);
    }
    PVar8 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0003);
    this->OldLinkDirMode = PVar8 != NEW;
    if (PVar8 != NEW) {
      pvVar13 = cmGeneratorTarget::GetLinkDirectories_abi_cxx11_(this->Target);
      __v = (pvVar13->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (pvVar13->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_150._M_dataplus._M_p = (pointer)local_100;
      if (__v != pbVar5) {
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    (local_100,(const_iterator)p_Var1,__v,(_Alloc_node *)&local_150);
          __v = __v + 1;
        } while (__v != pbVar5);
      }
    }
    pcVar4 = this->Makefile;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CMAKE_POLICY_WARNING_CMP0060","");
    bVar6 = cmMakefile::PolicyOptionalWarningEnabled(pcVar4,&local_150);
    this->CMP0060Warn = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

cmComputeLinkInformation::cmComputeLinkInformation(
  const cmGeneratorTarget* target, const std::string& config)
{
  // Store context information.
  this->Target = target;
  this->Makefile = this->Target->Target->GetMakefile();
  this->GlobalGenerator =
    this->Target->GetLocalGenerator()->GetGlobalGenerator();
  this->CMakeInstance = this->GlobalGenerator->GetCMakeInstance();

  // Check whether to recognize OpenBSD-style library versioned names.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");

  // The configuration being linked.
  this->Config = config;

  // Allocate internals.
  this->OrderLinkerSearchPath = new cmOrderDirectories(
    this->GlobalGenerator, target, "linker search path");
  this->OrderRuntimeSearchPath = new cmOrderDirectories(
    this->GlobalGenerator, target, "runtime search path");
  this->OrderDependentRPath = CM_NULLPTR;

  // Get the language used for linking this target.
  this->LinkLanguage = this->Target->GetLinkerLanguage(config);
  if (this->LinkLanguage.empty()) {
    // The Compute method will do nothing, so skip the rest of the
    // initialization.
    return;
  }

  // Check whether we should use an import library for linking a target.
  this->UseImportLibrary =
    this->Makefile->IsDefinitionSet("CMAKE_IMPORT_LIBRARY_SUFFIX");

  // Check whether we should skip dependencies on shared library files.
  this->LinkDependsNoShared =
    this->Target->GetPropertyAsBool("LINK_DEPENDS_NO_SHARED");

  // On platforms without import libraries there may be a special flag
  // to use when creating a plugin (module) that obtains symbols from
  // the program that will load it.
  this->LoaderFlag = CM_NULLPTR;
  if (!this->UseImportLibrary &&
      this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    std::string loader_flag_var = "CMAKE_SHARED_MODULE_LOADER_";
    loader_flag_var += this->LinkLanguage;
    loader_flag_var += "_FLAG";
    this->LoaderFlag = this->Makefile->GetDefinition(loader_flag_var);
  }

  // Get options needed to link libraries.
  this->LibLinkFlag =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FLAG");
  this->LibLinkFileFlag =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FILE_FLAG");
  this->LibLinkSuffix =
    this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX");

  // Get options needed to specify RPATHs.
  this->RuntimeUseChrpath = false;
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    const char* tType = ((this->Target->GetType() == cmStateEnums::EXECUTABLE)
                           ? "EXECUTABLE"
                           : "SHARED_LIBRARY");
    std::string rtVar = "CMAKE_";
    rtVar += tType;
    rtVar += "_RUNTIME_";
    rtVar += this->LinkLanguage;
    rtVar += "_FLAG";
    std::string rtSepVar = rtVar + "_SEP";
    this->RuntimeFlag = this->Makefile->GetSafeDefinition(rtVar);
    this->RuntimeSep = this->Makefile->GetSafeDefinition(rtSepVar);
    this->RuntimeAlways = (this->Makefile->GetSafeDefinition(
      "CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH"));

    this->RuntimeUseChrpath = this->Target->IsChrpathUsed(config);

    // Get options needed to help find dependent libraries.
    std::string rlVar = "CMAKE_";
    rlVar += tType;
    rlVar += "_RPATH_LINK_";
    rlVar += this->LinkLanguage;
    rlVar += "_FLAG";
    this->RPathLinkFlag = this->Makefile->GetSafeDefinition(rlVar);
  }

  // Check if we need to include the runtime search path at link time.
  {
    std::string var = "CMAKE_SHARED_LIBRARY_LINK_";
    var += this->LinkLanguage;
    var += "_WITH_RUNTIME_PATH";
    this->LinkWithRuntimePath = this->Makefile->IsOn(var);
  }

  // Check the platform policy for missing soname case.
  this->NoSONameUsesPath =
    this->Makefile->IsOn("CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME");

  // Get link type information.
  this->ComputeLinkTypeInfo();

  // Setup the link item parser.
  this->ComputeItemParserInfo();

  // Setup framework support.
  this->ComputeFrameworkInfo();

  // Choose a mode for dealing with shared library dependencies.
  this->SharedDependencyMode = SharedDepModeNone;
  if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_FILES")) {
    this->SharedDependencyMode = SharedDepModeLink;
  } else if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_DIRS")) {
    this->SharedDependencyMode = SharedDepModeLibDir;
  } else if (!this->RPathLinkFlag.empty()) {
    this->SharedDependencyMode = SharedDepModeDir;
    this->OrderDependentRPath = new cmOrderDirectories(
      this->GlobalGenerator, target, "dependent library path");
  }

  // Add the search path entries requested by the user to path ordering.
  this->OrderLinkerSearchPath->AddUserDirectories(
    this->Target->GetLinkDirectories());
  this->OrderRuntimeSearchPath->AddUserDirectories(
    this->Target->GetLinkDirectories());

  // Set up the implicit link directories.
  this->LoadImplicitLinkInfo();
  this->OrderLinkerSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  this->OrderRuntimeSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  if (this->OrderDependentRPath) {
    this->OrderDependentRPath->SetImplicitDirectories(this->ImplicitLinkDirs);
    this->OrderDependentRPath->AddLanguageDirectories(this->RuntimeLinkDirs);
  }

  // Decide whether to enable compatible library search path mode.
  // There exists code that effectively does
  //
  //    /path/to/libA.so -lB
  //
  // where -lB is meant to link to /path/to/libB.so.  This is broken
  // because it specified -lB without specifying a link directory (-L)
  // in which to search for B.  This worked in CMake 2.4 and below
  // because -L/path/to would be added by the -L/-l split for A.  In
  // order to support such projects we need to add the directories
  // containing libraries linked with a full path to the -L path.
  this->OldLinkDirMode =
    this->Target->GetPolicyStatusCMP0003() != cmPolicies::NEW;
  if (this->OldLinkDirMode) {
    // Construct a mask to not bother with this behavior for link
    // directories already specified by the user.
    std::vector<std::string> const& dirs = this->Target->GetLinkDirectories();
    this->OldLinkDirMask.insert(dirs.begin(), dirs.end());
  }

  this->CMP0060Warn = this->Makefile->PolicyOptionalWarningEnabled(
    "CMAKE_POLICY_WARNING_CMP0060");
}